

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestDeprecatedLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  string *value;
  TestDeprecatedLite **v1;
  TestDeprecatedLite **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena_00;
  TestDeprecatedLite *pTVar4;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  TestDeprecatedLite *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestDeprecatedLite *from;
  TestDeprecatedLite *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  TestDeprecatedLite *local_18;
  anon_union_32_1_493b367e_for_TestDeprecatedLite_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestDeprecatedLite *)to_msg;
  _this = (TestDeprecatedLite *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_68 = (TestDeprecatedLite *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestDeprecatedLite_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestDeprecatedLite*>
                 (&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestDeprecatedLite_const*,proto2_unittest::TestDeprecatedLite*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x1b13,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar4 = from;
  local_90 = *puVar3;
  if ((local_90 & 0xf) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_deprecated_field3_abi_cxx11_((TestDeprecatedLite *)arena);
      local_18 = pTVar4;
      local_10 = &pTVar4->field_0;
      puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar4->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar3 = *puVar3 | 1;
      arena_00 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.deprecated_field3_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x1b1d,"from._impl_.deprecated_field4_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.deprecated_field4_ == (TestDeprecatedLite *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
        local_28 = absl_log_internal_check_op_result;
        pTVar4 = (TestDeprecatedLite *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::TestDeprecatedLite>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.deprecated_field4_ = pTVar4;
      }
      else {
        MergeFrom((from->field_0)._impl_.deprecated_field4_,
                  (TestDeprecatedLite *)(arena->impl_).head_._M_b._M_p);
      }
    }
    if ((local_90 & 4) != 0) {
      (from->field_0)._impl_.deprecated_field_ = *(int32_t *)&(arena->impl_).first_owner_;
    }
    if ((local_90 & 8) != 0) {
      (from->field_0)._impl_.deprecated_field2_ =
           *(int32_t *)((long)&(arena->impl_).first_owner_ + 4);
    }
  }
  uVar1 = local_90;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestDeprecatedLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDeprecatedLite*>(&to_msg);
  auto& from = static_cast<const TestDeprecatedLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestDeprecatedLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_deprecated_field3(from._internal_deprecated_field3());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.deprecated_field4_ != nullptr);
      if (_this->_impl_.deprecated_field4_ == nullptr) {
        _this->_impl_.deprecated_field4_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.deprecated_field4_);
      } else {
        _this->_impl_.deprecated_field4_->MergeFrom(*from._impl_.deprecated_field4_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_field_ = from._impl_.deprecated_field_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.deprecated_field2_ = from._impl_.deprecated_field2_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}